

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  bool bVar1;
  void *pvVar2;
  int end_of_data;
  uchar *buff_out;
  void *buff_in;
  size_t bytes_out;
  size_t bytes_in;
  size_t new_size;
  void *p;
  size_t used;
  ulong uStack_30;
  int r;
  ssize_t bytes_avail;
  _7zip *zip;
  size_t minimum_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  zip = (_7zip *)minimum;
  minimum_local = (size_t)a;
  if ((*(long *)(bytes_avail + 0x128) == 0) && (*(long *)(bytes_avail + 0x130) == -1)) {
    if (minimum == 0) {
      zip = (_7zip *)0x1;
    }
    pvVar2 = __archive_read_ahead(a,(size_t)zip,(ssize_t *)&stack0xffffffffffffffd0);
    if ((pvVar2 == (void *)0x0) || ((long)uStack_30 < 1)) {
      archive_set_error((archive *)minimum_local,0x54,"Truncated 7-Zip file body");
      a_local = (archive_read *)0xffffffffffffffe2;
    }
    else {
      if (*(long *)(bytes_avail + 0x118) < (long)uStack_30) {
        uStack_30 = *(ulong *)(bytes_avail + 0x118);
      }
      *(ulong *)(bytes_avail + 0x118) = *(long *)(bytes_avail + 0x118) - uStack_30;
      if (*(long *)(bytes_avail + 0x108) < (long)uStack_30) {
        uStack_30 = *(ulong *)(bytes_avail + 0x108);
      }
      *(ulong *)(bytes_avail + 0x108) = *(long *)(bytes_avail + 0x108) - uStack_30;
      *(ulong *)(bytes_avail + 0xf0) = uStack_30;
      a_local = (archive_read *)0x0;
    }
  }
  else {
    if (*(long *)(bytes_avail + 0xd8) == 0) {
      *(undefined8 *)(bytes_avail + 0xe8) = 0x10000;
      if (*(ulong *)(bytes_avail + 0xe8) < minimum) {
        *(size_t *)(bytes_avail + 0xe8) = minimum + 0x3ff;
        *(ulong *)(bytes_avail + 0xe8) = *(ulong *)(bytes_avail + 0xe8) & 0xfffffffffffffc00;
      }
      pvVar2 = malloc(*(size_t *)(bytes_avail + 0xe8));
      *(void **)(bytes_avail + 0xd8) = pvVar2;
      if (*(long *)(bytes_avail + 0xd8) == 0) {
        archive_set_error((archive *)minimum_local,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      *(undefined8 *)(bytes_avail + 0xf0) = 0;
    }
    else if ((*(ulong *)(bytes_avail + 0xe8) < minimum) ||
            (*(ulong *)(bytes_avail + 0xf0) < minimum)) {
      if (*(long *)(bytes_avail + 0xe0) == 0) {
        p = (void *)0x0;
      }
      else {
        p = (void *)(*(long *)(bytes_avail + 0xe0) - *(long *)(bytes_avail + 0xd8));
      }
      if (*(ulong *)(bytes_avail + 0xe8) < minimum) {
        bytes_in = minimum + 0x3ff & 0xfffffffffffffc00;
        new_size = (size_t)realloc(*(void **)(bytes_avail + 0xd8),bytes_in);
        if ((void *)new_size == (void *)0x0) {
          archive_set_error((archive *)minimum_local,0xc,"No memory for 7-Zip decompression");
          return -0x1e;
        }
        *(size_t *)(bytes_avail + 0xd8) = new_size;
        *(size_t *)(bytes_avail + 0xe8) = bytes_in;
      }
      if (p != (void *)0x0) {
        memmove(*(void **)(bytes_avail + 0xd8),(void *)(*(long *)(bytes_avail + 0xd8) + (long)p),
                *(size_t *)(bytes_avail + 0xf0));
      }
    }
    else {
      *(undefined8 *)(bytes_avail + 0xf0) = 0;
    }
    *(undefined8 *)(bytes_avail + 0xe0) = 0;
    while (pvVar2 = __archive_read_ahead
                              ((archive_read *)minimum_local,1,(ssize_t *)&stack0xffffffffffffffd0),
          0 < (long)uStack_30) {
      buff_in = (void *)(*(long *)(bytes_avail + 0xe8) - *(long *)(bytes_avail + 0xf0));
      bytes_out = uStack_30;
      if (*(ulong *)(bytes_avail + 0x118) < uStack_30) {
        bytes_out = *(size_t *)(bytes_avail + 0x118);
      }
      used._4_4_ = decompress((archive_read *)minimum_local,(_7zip *)bytes_avail,
                              (void *)(*(long *)(bytes_avail + 0xd8) + *(long *)(bytes_avail + 0xf0)
                                      ),(size_t *)&buff_in,pvVar2,&bytes_out);
      if (used._4_4_ == 0) {
        bVar1 = false;
      }
      else {
        if (used._4_4_ != 1) {
          return -0x1e;
        }
        bVar1 = true;
      }
      *(size_t *)(bytes_avail + 0x118) = *(long *)(bytes_avail + 0x118) - bytes_out;
      if (*(void **)(bytes_avail + 0x108) < buff_in) {
        buff_in = *(void **)(bytes_avail + 0x108);
      }
      *(long *)(bytes_avail + 0x108) = *(long *)(bytes_avail + 0x108) - (long)buff_in;
      *(long *)(bytes_avail + 0xf0) = (long)buff_in + *(long *)(bytes_avail + 0xf0);
      *(size_t *)(bytes_avail + 0x120) = bytes_out;
      if ((*(long *)(bytes_avail + 0xf0) == *(long *)(bytes_avail + 0xe8)) ||
         ((((*(long *)(bytes_avail + 0x130) == 0x3030103 && (*(long *)(bytes_avail + 0x4e08) != 0))
           && (*(ulong *)(bytes_avail + 0xe8) < *(long *)(bytes_avail + 0xf0) + 5U)) ||
          ((*(long *)(bytes_avail + 0x118) == 0 && (*(long *)(bytes_avail + 0x108) == 0)))))) {
        if (*(_7zip **)(bytes_avail + 0xf0) < zip) {
          archive_set_error((archive *)minimum_local,-1,"Damaged 7-Zip archive");
          return -0x1e;
        }
        *(undefined8 *)(bytes_avail + 0xe0) = *(undefined8 *)(bytes_avail + 0xd8);
        return 0;
      }
      if ((bVar1) || ((bytes_out == 0 && (buff_in == (void *)0x0)))) {
        archive_set_error((archive *)minimum_local,-1,"Damaged 7-Zip archive");
        return -0x1e;
      }
      read_consume((archive_read *)minimum_local);
    }
    archive_set_error((archive *)minimum_local,0x54,"Truncated 7-Zip file body");
    a_local = (archive_read *)0xffffffffffffffe2;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}